

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O3

int test_socket_impl(char *file,int line,int family,int protocol)

{
  int iVar1;
  
  iVar1 = nn_socket(1,0x10);
  if (iVar1 != -1) {
    return iVar1;
  }
  test_socket_impl_cold_1();
}

Assistant:

static int NN_UNUSED test_socket_impl (char *file, int line, int family,
    int protocol)
{
    int sock;

    sock = nn_socket (family, protocol);
    if (sock == -1) {
        fprintf (stderr, "Failed create socket: %s [%d] (%s:%d)\n",
            nn_err_strerror (errno),
            (int) errno, file, line);
        nn_err_abort ();
    }

    return sock;
}